

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

int __thiscall
cmCTestMultiProcessHandler::SearchByName(cmCTestMultiProcessHandler *this,string *name)

{
  __type _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_color _Var3;
  
  _Var3 = ~_S_red;
  for (p_Var2 = (this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->Properties).
       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &p_Var2[1]._M_parent[1]._M_parent,name);
    if (_Var1) {
      _Var3 = p_Var2[1]._M_color;
    }
  }
  return _Var3;
}

Assistant:

int cmCTestMultiProcessHandler::SearchByName(std::string const& name)
{
  int index = -1;

  for (auto const& p : this->Properties) {
    if (p.second->Name == name) {
      index = p.first;
    }
  }
  return index;
}